

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O1

void __thiscall QTextHtmlExporter::emitFontFamily(QTextHtmlExporter *this,QStringList *families)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  qsizetype qVar4;
  long lVar5;
  QString *family;
  QString *pQVar6;
  long in_FS_OFFSET;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QStringView local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar7.m_data = (char *)0xd;
  QVar7.m_size = (qsizetype)this;
  QString::append(QVar7);
  lVar5 = (families->d).size;
  if (lVar5 != 0) {
    pQVar6 = (families->d).ptr;
    lVar5 = lVar5 * 0x18;
    bVar2 = true;
    do {
      local_50.m_data = (pQVar6->d).ptr;
      local_50.m_size = (pQVar6->d).size;
      qVar4 = QStringView::indexOf(&local_50,(QChar)0x27,0,CaseSensitive);
      bVar3 = false;
      if (!bVar2) {
        QVar8.m_data = (char *)0x1;
        QVar8.m_size = (qsizetype)this;
        QString::append(QVar8);
        bVar3 = bVar2;
      }
      bVar2 = bVar3;
      pcVar1 = (char *)((ulong)(qVar4 != -1) * 5 + 1);
      QVar9.m_data = pcVar1;
      QVar9.m_size = (qsizetype)this;
      QString::append(QVar9);
      QString::toHtmlEscaped();
      QString::append(&this->html);
      if ((QArrayData *)local_50.m_size != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_50.m_size)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_50.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_50.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.m_size,2,0x10);
        }
      }
      QVar10.m_data = pcVar1;
      QVar10.m_size = (qsizetype)this;
      QString::append(QVar10);
      pQVar6 = pQVar6 + 1;
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != 0);
  }
  QString::append((QChar)(char16_t)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlExporter::emitFontFamily(const QStringList &families)
{
    html += " font-family:"_L1;

    bool first = true;
    for (const QString &family : families) {
        auto quote = "\'"_L1;
        if (family.contains(u'\''))
            quote = "&quot;"_L1;

        if (!first)
            html += ","_L1;
        else
            first = false;
        html += quote;
        html += family.toHtmlEscaped();
        html += quote;
    }
    html += u';';
}